

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::DrawPins(BoardView *this,ImDrawList *draw)

{
  uint8_t uVar1;
  Net *pNVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  undefined4 extraout_var;
  element_type *peVar7;
  element_type *peVar8;
  ImGuiIO *pIVar9;
  ImFont **ppIVar10;
  float *pfVar11;
  BoardView *in_RSI;
  BoardView *in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  ImFont *font_net_name;
  ImFont *font_pin_name;
  ImVec2 pos_net_name;
  ImVec2 pos_pin_name;
  ImVec2 size_net_name;
  ImVec2 size_pin_name;
  float maxfontsize;
  float maxfontheight;
  float maxfontwidth;
  ImVec2 text_size_normalized;
  ImFont *font;
  string text;
  float h;
  int segments;
  ImVec2 pos;
  bool draw_ring;
  bool show_text;
  bool fill_pin;
  uint32_t color;
  uint32_t text_color;
  uint32_t fill_color;
  float psz;
  shared_ptr<Pin> *pin;
  iterator __end1;
  iterator __begin1;
  SharedVector<Pin> *__range1;
  ImGuiIO io;
  float threshold;
  uint32_t omask;
  uint32_t cmask;
  ImGuiIO *in_stack_ffffffffffffc3c8;
  BoardView *in_stack_ffffffffffffc3d0;
  BoardView *in_stack_ffffffffffffc3d8;
  float in_stack_ffffffffffffc3e0;
  float in_stack_ffffffffffffc3e4;
  BoardView *in_stack_ffffffffffffc3e8;
  BoardView *in_stack_ffffffffffffc3f0;
  float in_stack_ffffffffffffc3f8;
  float in_stack_ffffffffffffc3fc;
  BoardView *text_end;
  ImGuiIO *in_stack_ffffffffffffc408;
  ImGuiIO *in_stack_ffffffffffffc410;
  ImGuiIO *in_stack_ffffffffffffc418;
  ImGuiIO *in_stack_ffffffffffffc420;
  ImGuiIO *in_stack_ffffffffffffc428;
  ImGuiIO *in_stack_ffffffffffffc430;
  BoardView *in_stack_ffffffffffffc438;
  undefined4 in_stack_ffffffffffffc440;
  float fVar12;
  undefined1 in_stack_ffffffffffffc448 [16];
  BoardView *in_stack_ffffffffffffc458;
  undefined4 in_stack_ffffffffffffc460;
  float in_stack_ffffffffffffc464;
  undefined1 in_stack_ffffffffffffc468 [16];
  undefined1 in_stack_ffffffffffffc488 [16];
  ImVec2 local_3aa8;
  ImVec2 local_3aa0;
  BoardView *local_3a98;
  BoardView *local_3a90;
  ImVec2 local_3a84;
  ImVec2 local_3a7c;
  ImVec2 local_3a74;
  ImVec2 local_3a6c;
  float local_3a64;
  float local_3a60;
  float local_3a5c;
  ImVec2 local_3a58;
  BoardView *local_3a50;
  string local_3a48 [32];
  string local_3a28 [32];
  ImVec2 local_3a08;
  ImVec2 local_3a00;
  ImVec2 local_39f8;
  ImVec2 local_39f0;
  ImVec2 local_39e8;
  ImVec2 local_39e0;
  ImVec2 local_39d8;
  ImVec2 local_39d0;
  ImVec2 local_39c8;
  ImVec2 local_39c0;
  ImVec2 local_39b8;
  ImVec2 local_39b0;
  ImVec2 local_39a8;
  ImVec2 local_39a0;
  float local_3998;
  int local_3994;
  ImVec2 local_3980;
  byte local_3963;
  byte local_3962;
  byte local_3961;
  uint local_3960;
  float local_395c;
  uint local_3958;
  float local_3954;
  reference local_3950;
  shared_ptr<Pin> *local_3948;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_3940;
  undefined8 local_3938;
  undefined4 local_391c;
  ImGuiIO local_3918;
  float local_1c;
  uint32_t local_18;
  uint32_t local_14;
  BoardView *local_10;
  
  local_14 = 0xffffffff;
  local_18 = 0;
  local_1c = 0.0;
  local_10 = in_RSI;
  ImGui::GetIO();
  ImGuiIO::ImGuiIO((ImGuiIO *)in_stack_ffffffffffffc3d0,in_stack_ffffffffffffc3c8);
  if (((in_RDI->config).showPins & 1U) == 0) {
    local_391c = 1;
  }
  else {
    if ((((in_RDI->config).pinSelectMasks & 1U) != 0) &&
       ((bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->m_pinSelected),
        bVar4 || (sVar6 = std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                          ::size(&in_RDI->m_pinHighlighted), sVar6 != 0)))) {
      local_14 = (in_RDI->m_colors).selectedMaskPins;
      local_18 = (in_RDI->m_colors).orMaskPins;
    }
    if (((in_RDI->config).slowCPU & 1U) != 0) {
      local_1c = 2.0;
    }
    if (local_1c < (in_RDI->config).pinSizeThresholdLow) {
      local_1c = (in_RDI->config).pinSizeThresholdLow;
    }
    ImDrawList::ChannelsSetCurrent
              ((ImDrawList *)in_stack_ffffffffffffc3d0,
               (int)((ulong)in_stack_ffffffffffffc3c8 >> 0x20));
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->m_pinSelected);
    if (bVar4) {
      DrawNetWeb(in_stack_ffffffffffffc488._8_8_,in_stack_ffffffffffffc488._0_8_);
    }
    iVar5 = (*in_RDI->m_board->_vptr_Board[4])();
    local_3938 = CONCAT44(extraout_var,iVar5);
    local_3940._M_current =
         (shared_ptr<Pin> *)
         std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                   ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                    in_stack_ffffffffffffc3c8);
    local_3948 = (shared_ptr<Pin> *)
                 std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                           ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                            in_stack_ffffffffffffc3c8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)in_stack_ffffffffffffc3d0,
                              (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)in_stack_ffffffffffffc3c8), bVar4) {
      local_3950 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                   ::operator*(&local_3940);
      peVar7 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x137684);
      local_3954 = peVar7->diameter * in_RDI->m_scale;
      local_3958 = 0xffff8888;
      local_395c = (float)(in_RDI->m_colors).pinDefaultTextColor;
      local_3960 = (in_RDI->m_colors).pinDefaultColor & local_14 | local_18;
      local_3961 = 0;
      local_3962 = 0;
      local_3963 = 1;
      std::shared_ptr<BoardElement>::shared_ptr<Pin,void>
                ((shared_ptr<BoardElement> *)in_stack_ffffffffffffc3d0,
                 (shared_ptr<Pin> *)in_stack_ffffffffffffc3c8);
      bVar4 = BoardElementIsVisible
                        (in_stack_ffffffffffffc3e8,
                         (shared_ptr<BoardElement> *)
                         CONCAT44(in_stack_ffffffffffffc3e4,in_stack_ffffffffffffc3e0));
      std::shared_ptr<BoardElement>::~shared_ptr((shared_ptr<BoardElement> *)0x137750);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x137795);
        std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1377b0);
        local_3980 = CoordToScreen(in_stack_ffffffffffffc3e8,in_stack_ffffffffffffc3e4,
                                   in_stack_ffffffffffffc3e0,
                                   (float)((ulong)in_stack_ffffffffffffc3d8 >> 0x20));
        bVar4 = IsVisibleScreen(in_RDI,local_3980.x,local_3980.y,local_3954,&local_3918);
        if ((bVar4) &&
           ((bVar4 = std::__shared_ptr::operator_cast_to_bool
                               ((__shared_ptr *)&in_RDI->m_pinSelected), bVar4 ||
            (local_1c <= local_3954)))) {
          bVar4 = contains<std::shared_ptr<Pin>>
                            ((shared_ptr<Pin> *)in_stack_ffffffffffffc3f0,
                             (vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *
                             )in_stack_ffffffffffffc3e8);
          if (bVar4) {
            if ((double)local_3954 < (in_RDI->config).fontSize / 2.0) {
              local_3954 = (float)((in_RDI->config).fontSize / 2.0);
            }
            local_395c = (float)(in_RDI->m_colors).pinSelectedTextColor;
            local_3958 = (in_RDI->m_colors).pinSelectedFillColor;
            local_3960 = (in_RDI->m_colors).pinSelectedColor;
            local_3961 = 1;
            local_3962 = 1;
            local_3963 = 1;
            local_1c = 0.0;
          }
          std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x13795a)
          ;
          std::shared_ptr<Component>::shared_ptr
                    ((shared_ptr<Component> *)in_stack_ffffffffffffc3d0,
                     (shared_ptr<Component> *)in_stack_ffffffffffffc3c8);
          bVar4 = PartIsHighlighted(in_stack_ffffffffffffc3f0,
                                    (shared_ptr<Component> *)in_stack_ffffffffffffc3e8);
          std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x1379a1);
          if (bVar4) {
            local_3960 = (in_RDI->m_colors).pinDefaultColor;
            local_395c = (float)(in_RDI->m_colors).pinDefaultTextColor;
            local_3961 = 0;
            local_3963 = 1;
            local_3962 = 1;
            local_1c = 0.0;
          }
          peVar7 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              0x137a29);
          if (*(int *)&(peVar7->super_BoardElement).field_0xc == 4) {
            local_3960 = (in_RDI->m_colors).pinTestPadColor & local_14 | local_18;
            local_3958 = (in_RDI->m_colors).pinTestPadFillColor & local_14 | local_18;
            local_3962 = 0;
          }
          std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x137a82)
          ;
          peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x137a8e);
          uVar1 = peVar8->visualmode;
          std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x137aa9)
          ;
          std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x137ab5);
          if (uVar1 == '\x01') {
            local_3960 = (in_RDI->m_colors).pinDefaultColor;
            local_395c = (float)(in_RDI->m_colors).pinDefaultTextColor;
            local_3961 = 0;
            local_3963 = 1;
            local_3962 = 1;
            local_1c = 0.0;
          }
          peVar7 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              0x137b14);
          if ((peVar7->net == (Net *)0x0) ||
             (peVar7 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x137b28), *(int *)&(peVar7->super_BoardElement).field_0xc == 1
             )) {
            local_3960 = (in_RDI->m_colors).pinNotConnectedColor & local_14 | local_18;
          }
          else {
            peVar7 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x137b60);
            if ((peVar7->net->is_ground & 1U) != 0) {
              local_3960 = (in_RDI->m_colors).pinGroundColor & local_14 | local_18;
            }
          }
          bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->m_pinSelected);
          if (bVar4) {
            peVar7 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x137bb9);
            pNVar2 = peVar7->net;
            peVar7 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x137bd9);
            if (pNVar2 == peVar7->net) {
              if ((double)local_3954 < (in_RDI->config).fontSize / 2.0) {
                local_3954 = (float)((in_RDI->config).fontSize / 2.0);
              }
              local_3960 = (in_RDI->m_colors).pinSameNetColor;
              local_395c = (float)(in_RDI->m_colors).pinSameNetTextColor;
              local_3958 = (in_RDI->m_colors).pinSameNetFillColor;
              local_3963 = 0;
              local_3961 = 1;
              local_3962 = 1;
              local_1c = 0.0;
            }
          }
          bVar4 = std::operator==((shared_ptr<Pin> *)in_stack_ffffffffffffc3d0,
                                  (shared_ptr<Pin> *)in_stack_ffffffffffffc3c8);
          if (bVar4) {
            if ((double)local_3954 < (in_RDI->config).fontSize / 2.0) {
              local_3954 = (float)((in_RDI->config).fontSize / 2.0);
            }
            local_3960 = (in_RDI->m_colors).pinSelectedColor;
            local_395c = (float)(in_RDI->m_colors).pinSelectedTextColor;
            local_3958 = (in_RDI->m_colors).pinSelectedFillColor;
            local_3963 = 0;
            local_3962 = 1;
            local_3961 = 1;
            local_1c = 0.0;
          }
          std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x137d76)
          ;
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffc3d0,(char *)in_stack_ffffffffffffc3c8);
          if (bVar4) {
            local_3960 = (in_RDI->m_colors).pinA1PadColor;
            local_3961 = (in_RDI->m_colors).pinA1PadColor != 0;
            local_3963 = 0;
            local_3958 = local_3960;
          }
          std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x137de3)
          ;
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffc3d0,(char *)in_stack_ffffffffffffc3c8);
          if (bVar4) {
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x137e19);
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x137e25);
            sVar6 = std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::size
                              (&peVar8->pins);
            if ((uint)(in_RDI->config).pinA1threshold <= sVar6) {
              local_3960 = (in_RDI->m_colors).pinA1PadColor;
              local_3961 = (in_RDI->m_colors).pinA1PadColor != 0;
              local_3963 = 0;
              local_3958 = local_3960;
            }
          }
          std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x137e8a)
          ;
          peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x137e96);
          sVar6 = std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::size
                            (&peVar8->pins);
          if (sVar6 < 2) {
            local_3962 = 0;
          }
          peVar7 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              0x137ebd);
          if (*(int *)&(peVar7->super_BoardElement).field_0xc == 4) {
            local_3962 = 0;
          }
          dVar3 = std::round((double)(ulong)(uint)local_3954);
          local_3994 = (int)SUB84(dVar3,0);
          if (0x20 < local_3994) {
            local_3994 = 0x20;
          }
          if (local_3994 < 8) {
            local_3994 = 8;
          }
          local_3998 = local_3954 / 2.0 + 0.5;
          if (((local_3962 & 1) != 0) && ((double)local_3954 < (in_RDI->config).fontSize / 2.0)) {
            local_3954 = (float)((in_RDI->config).fontSize / 2.0);
          }
          peVar7 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              0x137fbb);
          if (*(int *)&(peVar7->super_BoardElement).field_0xc == 4) {
            if ((local_3954 <= 3.0) || (((in_RDI->config).slowCPU & 1U) != 0)) {
              if (local_1c < local_3954) {
                ImVec2::ImVec2(&local_39b0,local_3980.x - local_3998,local_3980.y - local_3998);
                ImVec2::ImVec2(&local_39b8,local_3980.x + local_3998,local_3980.y + local_3998);
                ImDrawList::AddRectFilled
                          ((ImDrawList *)in_stack_ffffffffffffc3f0,
                           (ImVec2 *)in_stack_ffffffffffffc3e8,
                           (ImVec2 *)CONCAT44(in_stack_ffffffffffffc3e4,in_stack_ffffffffffffc3e0),
                           (ImU32)((ulong)in_stack_ffffffffffffc3d8 >> 0x20),
                           SUB84(in_stack_ffffffffffffc3d8,0),
                           (ImDrawFlags)((ulong)in_stack_ffffffffffffc3d0 >> 0x20));
              }
            }
            else {
              ImVec2::ImVec2(&local_39a0,local_3980.x,local_3980.y);
              ImDrawList::AddCircleFilled
                        ((ImDrawList *)CONCAT44(in_stack_ffffffffffffc3e4,in_stack_ffffffffffffc3e0)
                         ,(ImVec2 *)in_stack_ffffffffffffc3d8,
                         (float)((ulong)in_stack_ffffffffffffc3d0 >> 0x20),
                         (ImU32)in_stack_ffffffffffffc3d0,
                         (int)((ulong)in_stack_ffffffffffffc3c8 >> 0x20));
              ImVec2::ImVec2(&local_39a8,local_3980.x,local_3980.y);
              ImDrawList::AddCircle
                        ((ImDrawList *)in_stack_ffffffffffffc3f0,(ImVec2 *)in_stack_ffffffffffffc3e8
                         ,in_stack_ffffffffffffc3e4,(ImU32)in_stack_ffffffffffffc3e0,
                         (int)((ulong)in_stack_ffffffffffffc3d8 >> 0x20),
                         SUB84(in_stack_ffffffffffffc3d8,0));
            }
          }
          else if ((local_3954 <= 3.0) || (local_3954 <= local_1c)) {
            if (local_1c < local_3954) {
              if ((local_3961 & 1) != 0) {
                ImVec2::ImVec2(&local_39f0,local_3980.x - local_3998,local_3980.y - local_3998);
                ImVec2::ImVec2(&local_39f8,local_3980.x + local_3998,local_3980.y + local_3998);
                ImDrawList::AddRectFilled
                          ((ImDrawList *)in_stack_ffffffffffffc3f0,
                           (ImVec2 *)in_stack_ffffffffffffc3e8,
                           (ImVec2 *)CONCAT44(in_stack_ffffffffffffc3e4,in_stack_ffffffffffffc3e0),
                           (ImU32)((ulong)in_stack_ffffffffffffc3d8 >> 0x20),
                           SUB84(in_stack_ffffffffffffc3d8,0),
                           (ImDrawFlags)((ulong)in_stack_ffffffffffffc3d0 >> 0x20));
              }
              if ((local_3963 & 1) != 0) {
                ImVec2::ImVec2(&local_3a00,local_3980.x - local_3998,local_3980.y - local_3998);
                ImVec2::ImVec2(&local_3a08,local_3980.x + local_3998,local_3980.y + local_3998);
                ImDrawList::AddRect(in_stack_ffffffffffffc468._8_8_,in_stack_ffffffffffffc468._0_8_,
                                    (ImVec2 *)
                                    CONCAT44(in_stack_ffffffffffffc464,in_stack_ffffffffffffc460),
                                    (ImU32)((ulong)in_stack_ffffffffffffc458 >> 0x20),
                                    SUB84(in_stack_ffffffffffffc458,0),
                                    in_stack_ffffffffffffc448._12_4_,in_stack_ffffffffffffc448._8_4_
                                   );
              }
            }
          }
          else if ((((in_RDI->config).pinShapeSquare & 1U) == 0) &&
                  (((in_RDI->config).slowCPU & 1U) == 0)) {
            if ((local_3961 & 1) != 0) {
              ImVec2::ImVec2(&local_39e0,local_3980.x,local_3980.y);
              ImDrawList::AddCircleFilled
                        ((ImDrawList *)CONCAT44(in_stack_ffffffffffffc3e4,in_stack_ffffffffffffc3e0)
                         ,(ImVec2 *)in_stack_ffffffffffffc3d8,
                         (float)((ulong)in_stack_ffffffffffffc3d0 >> 0x20),
                         (ImU32)in_stack_ffffffffffffc3d0,
                         (int)((ulong)in_stack_ffffffffffffc3c8 >> 0x20));
            }
            if ((local_3963 & 1) != 0) {
              ImVec2::ImVec2(&local_39e8,local_3980.x,local_3980.y);
              ImDrawList::AddCircle
                        ((ImDrawList *)in_stack_ffffffffffffc3f0,(ImVec2 *)in_stack_ffffffffffffc3e8
                         ,in_stack_ffffffffffffc3e4,(ImU32)in_stack_ffffffffffffc3e0,
                         (int)((ulong)in_stack_ffffffffffffc3d8 >> 0x20),
                         SUB84(in_stack_ffffffffffffc3d8,0));
            }
          }
          else {
            if ((local_3961 & 1) != 0) {
              ImVec2::ImVec2(&local_39c0,local_3980.x - local_3998,local_3980.y - local_3998);
              ImVec2::ImVec2(&local_39c8,local_3980.x + local_3998,local_3980.y + local_3998);
              ImDrawList::AddRectFilled
                        ((ImDrawList *)in_stack_ffffffffffffc3f0,(ImVec2 *)in_stack_ffffffffffffc3e8
                         ,(ImVec2 *)CONCAT44(in_stack_ffffffffffffc3e4,in_stack_ffffffffffffc3e0),
                         (ImU32)((ulong)in_stack_ffffffffffffc3d8 >> 0x20),
                         SUB84(in_stack_ffffffffffffc3d8,0),
                         (ImDrawFlags)((ulong)in_stack_ffffffffffffc3d0 >> 0x20));
            }
            if ((local_3963 & 1) != 0) {
              ImVec2::ImVec2(&local_39d0,local_3980.x - local_3998,local_3980.y - local_3998);
              ImVec2::ImVec2(&local_39d8,local_3980.x + local_3998,local_3980.y + local_3998);
              ImDrawList::AddRect(in_stack_ffffffffffffc468._8_8_,in_stack_ffffffffffffc468._0_8_,
                                  (ImVec2 *)
                                  CONCAT44(in_stack_ffffffffffffc464,in_stack_ffffffffffffc460),
                                  (ImU32)((ulong)in_stack_ffffffffffffc458 >> 0x20),
                                  SUB84(in_stack_ffffffffffffc458,0),
                                  in_stack_ffffffffffffc448._12_4_,in_stack_ffffffffffffc448._8_4_);
            }
          }
          if (((((in_RDI->config).showPinName & 1U) != 0) && (3.0 < local_3954)) ||
             ((local_3962 & 1) != 0)) {
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1385f3);
            iVar5 = (int)((ulong)in_stack_ffffffffffffc3c8 >> 0x20);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffc3fc,in_stack_ffffffffffffc3f8),
                           (char *)in_stack_ffffffffffffc3f0);
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x13861d);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffc3d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffc3d0);
            std::__cxx11::string::~string(local_3a48);
            pIVar9 = ImGui::GetIO();
            ppIVar10 = ImVector<ImFont_*>::operator[](&pIVar9->Fonts->Fonts,0);
            local_3a50 = (BoardView *)*ppIVar10;
            std::__cxx11::string::c_str();
            local_3a58 = ImFont::CalcTextSizeA
                                   ((ImFont *)in_stack_ffffffffffffc438,
                                    (float)((ulong)in_stack_ffffffffffffc430 >> 0x20),
                                    SUB84(in_stack_ffffffffffffc430,0),
                                    (float)((ulong)in_stack_ffffffffffffc428 >> 0x20),
                                    (char *)in_stack_ffffffffffffc420,
                                    (char *)in_stack_ffffffffffffc418,
                                    (char **)in_stack_ffffffffffffc410);
            local_3a5c = (local_3954 * 2.125) / local_3a58.x;
            local_3a60 = (local_3954 * 1.5) / local_3a58.y;
            pfVar11 = std::min<float>(&local_3a5c,&local_3a60);
            local_3a64 = *pfVar11;
            in_stack_ffffffffffffc458 = local_3a50;
            in_stack_ffffffffffffc464 = local_3a60;
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1387a7);
            std::__cxx11::string::c_str();
            local_3a6c = ImFont::CalcTextSizeA
                                   ((ImFont *)in_stack_ffffffffffffc438,
                                    (float)((ulong)in_stack_ffffffffffffc430 >> 0x20),
                                    SUB84(in_stack_ffffffffffffc430,0),
                                    (float)((ulong)in_stack_ffffffffffffc428 >> 0x20),
                                    (char *)in_stack_ffffffffffffc420,
                                    (char *)in_stack_ffffffffffffc418,
                                    (char **)in_stack_ffffffffffffc410);
            in_stack_ffffffffffffc468._8_4_ = extraout_XMM0_Dc;
            in_stack_ffffffffffffc468._0_4_ = local_3a6c.x;
            in_stack_ffffffffffffc468._4_4_ = local_3a6c.y;
            in_stack_ffffffffffffc468._12_4_ = extraout_XMM0_Dd;
            in_stack_ffffffffffffc438 = local_3a50;
            fVar12 = local_3a64;
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x138822);
            std::__cxx11::string::c_str();
            local_3a74 = ImFont::CalcTextSizeA
                                   ((ImFont *)in_stack_ffffffffffffc438,
                                    (float)((ulong)in_stack_ffffffffffffc430 >> 0x20),
                                    SUB84(in_stack_ffffffffffffc430,0),
                                    (float)((ulong)in_stack_ffffffffffffc428 >> 0x20),
                                    (char *)in_stack_ffffffffffffc420,
                                    (char *)in_stack_ffffffffffffc418,
                                    (char **)in_stack_ffffffffffffc410);
            in_stack_ffffffffffffc448._8_4_ = extraout_XMM0_Dc_00;
            in_stack_ffffffffffffc448._0_4_ = local_3a74.x;
            in_stack_ffffffffffffc448._4_4_ = local_3a74.y;
            in_stack_ffffffffffffc448._12_4_ = extraout_XMM0_Dd_00;
            ImVec2::ImVec2(&local_3a7c,local_3980.x + local_3a6c.x * -0.5,
                           local_3980.y - local_3a6c.y);
            ImVec2::ImVec2(&local_3a84,local_3980.x + local_3a74.x * -0.5,local_3980.y);
            local_3a90 = local_3a50;
            if (*(float *)&(local_3a50->backgroundImage).topImage.file._M_pathname.field_0x4 * 0.75
                <= local_3a60) {
              if (*(float *)&(local_3a50->backgroundImage).topImage.file._M_pathname.field_0x4 * 1.5
                  < local_3a60) {
                in_stack_ffffffffffffc428 = ImGui::GetIO();
                ppIVar10 = ImVector<ImFont_*>::operator[]
                                     (&in_stack_ffffffffffffc428->Fonts->Fonts,1);
                pfVar11 = (float *)&(local_3a50->backgroundImage).topImage.file._M_pathname.
                                    field_0x4;
                if (*pfVar11 <= (*ppIVar10)->FontSize && (*ppIVar10)->FontSize != *pfVar11) {
                  in_stack_ffffffffffffc420 = ImGui::GetIO();
                  ppIVar10 = ImVector<ImFont_*>::operator[]
                                       (&in_stack_ffffffffffffc420->Fonts->Fonts,1);
                  local_3a90 = (BoardView *)*ppIVar10;
                }
              }
            }
            else {
              in_stack_ffffffffffffc430 = ImGui::GetIO();
              ppIVar10 = ImVector<ImFont_*>::operator[](&in_stack_ffffffffffffc430->Fonts->Fonts,2);
              local_3a90 = (BoardView *)*ppIVar10;
            }
            local_3a98 = local_3a50;
            if (*(float *)&(local_3a50->backgroundImage).topImage.file._M_pathname.field_0x4 * 0.75
                <= local_3a64) {
              if (*(float *)&(local_3a50->backgroundImage).topImage.file._M_pathname.field_0x4 * 1.5
                  < local_3a64) {
                in_stack_ffffffffffffc410 = ImGui::GetIO();
                ppIVar10 = ImVector<ImFont_*>::operator[]
                                     (&in_stack_ffffffffffffc410->Fonts->Fonts,1);
                pfVar11 = (float *)&(local_3a50->backgroundImage).topImage.file._M_pathname.
                                    field_0x4;
                if (*pfVar11 <= (*ppIVar10)->FontSize && (*ppIVar10)->FontSize != *pfVar11) {
                  in_stack_ffffffffffffc408 = ImGui::GetIO();
                  ppIVar10 = ImVector<ImFont_*>::operator[]
                                       (&in_stack_ffffffffffffc408->Fonts->Fonts,1);
                  local_3a98 = (BoardView *)*ppIVar10;
                }
              }
            }
            else {
              in_stack_ffffffffffffc418 = ImGui::GetIO();
              ppIVar10 = ImVector<ImFont_*>::operator[](&in_stack_ffffffffffffc418->Fonts->Fonts,2);
              local_3a98 = (BoardView *)*ppIVar10;
            }
            text_end = local_10;
            ImVec2::ImVec2(&local_3aa0,local_3a84.x + in_RDI->m_scale * -0.5,local_3a84.y);
            ImVec2::ImVec2(&local_3aa8,in_RDI->m_scale * 0.5 + local_3a84.x + local_3a74.x,
                           local_3a84.y + local_3a74.y);
            ImDrawList::AddRectFilled
                      ((ImDrawList *)in_stack_ffffffffffffc3f0,(ImVec2 *)in_stack_ffffffffffffc3e8,
                       (ImVec2 *)CONCAT44(in_stack_ffffffffffffc3e4,in_stack_ffffffffffffc3e0),
                       (ImU32)((ulong)in_stack_ffffffffffffc3d8 >> 0x20),
                       SUB84(in_stack_ffffffffffffc3d8,0),
                       (ImDrawFlags)((ulong)in_stack_ffffffffffffc3d0 >> 0x20));
            ImDrawList::ChannelsSetCurrent((ImDrawList *)in_stack_ffffffffffffc3d0,iVar5);
            in_stack_ffffffffffffc3e8 = local_10;
            in_stack_ffffffffffffc3f0 = local_3a90;
            in_stack_ffffffffffffc3f8 = local_3a60;
            in_stack_ffffffffffffc3fc = local_395c;
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x138c93);
            std::__cxx11::string::c_str();
            ImDrawList::AddText((ImDrawList *)in_stack_ffffffffffffc430,
                                (ImFont *)in_stack_ffffffffffffc428,
                                (float)((ulong)in_stack_ffffffffffffc420 >> 0x20),
                                (ImVec2 *)in_stack_ffffffffffffc418,
                                (ImU32)((ulong)in_stack_ffffffffffffc410 >> 0x20),
                                (char *)in_stack_ffffffffffffc408,(char *)text_end,
                                in_stack_ffffffffffffc3fc,
                                (ImVec4 *)CONCAT44(fVar12,in_stack_ffffffffffffc440));
            in_stack_ffffffffffffc3d0 = local_10;
            in_stack_ffffffffffffc3d8 = local_3a98;
            in_stack_ffffffffffffc3e0 = local_3a64;
            in_stack_ffffffffffffc3e4 = local_395c;
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x138d18);
            std::__cxx11::string::c_str();
            in_stack_ffffffffffffc3c8 = (ImGuiIO *)0x0;
            ImDrawList::AddText((ImDrawList *)in_stack_ffffffffffffc430,
                                (ImFont *)in_stack_ffffffffffffc428,
                                (float)((ulong)in_stack_ffffffffffffc420 >> 0x20),
                                (ImVec2 *)in_stack_ffffffffffffc418,
                                (ImU32)((ulong)in_stack_ffffffffffffc410 >> 0x20),
                                (char *)in_stack_ffffffffffffc408,(char *)text_end,
                                in_stack_ffffffffffffc3fc,
                                (ImVec4 *)CONCAT44(fVar12,in_stack_ffffffffffffc440));
            ImDrawList::ChannelsSetCurrent
                      ((ImDrawList *)in_stack_ffffffffffffc3d0,
                       (int)((ulong)in_stack_ffffffffffffc3c8 >> 0x20));
            std::__cxx11::string::~string(local_3a28);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
      ::operator++(&local_3940);
    }
    local_391c = 0;
  }
  ImGuiIO::~ImGuiIO((ImGuiIO *)0x138daa);
  return;
}

Assistant:

inline void BoardView::DrawPins(ImDrawList *draw) {

	uint32_t cmask  = 0xFFFFFFFF;
	uint32_t omask  = 0x00000000;
	float threshold = 0;
	auto io         = ImGui::GetIO();

	if (!config.showPins) return;

	/*
	 * If we have a pin selected, then it makes it
	 * easier to see where the associated pins are
	 * by masking out (alpha or channel) the other
	 * pins so they're fainter.
	 */
	if (config.pinSelectMasks) {
		if (m_pinSelected || m_pinHighlighted.size()) {
			cmask = m_colors.selectedMaskPins;
			omask = m_colors.orMaskPins;
		}
	}

	if (config.slowCPU) {
		threshold      = 2.0f;
	}
	if (config.pinSizeThresholdLow > threshold) threshold = config.pinSizeThresholdLow;

	draw->ChannelsSetCurrent(kChannelPins);

	if (m_pinSelected) DrawNetWeb(draw);

	for (auto &pin : m_board->Pins()) {
		float psz           = pin->diameter * m_scale;
		uint32_t fill_color = 0xFFFF8888; // fallback fill colour
		uint32_t text_color = m_colors.pinDefaultTextColor;
		uint32_t color      = (m_colors.pinDefaultColor & cmask) | omask;
		bool fill_pin       = false;
		bool show_text      = false;
		bool draw_ring      = true;

		// continue if pin is not visible anyway
		if (!BoardElementIsVisible(pin)) continue;

		ImVec2 pos = CoordToScreen(pin->position.x, pin->position.y);
		{
			if (!IsVisibleScreen(pos.x, pos.y, psz, io)) continue;
		}

		if ((!m_pinSelected) && (psz < threshold)) continue;

		// color & text depending on app state & pin type

		{
			/*
			 * Pins resulting from a net search
			 */
			if (contains(pin, m_pinHighlighted)) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				text_color = m_colors.pinSelectedTextColor;
				fill_color = m_colors.pinSelectedFillColor;
				color      = m_colors.pinSelectedColor;
				// text_color = color = m_colors.pinSameNetColor;
				fill_pin  = true;
				show_text = true;
				draw_ring = true;
				threshold = 0;
				//				draw->AddCircle(ImVec2(pos.x, pos.y), psz * pinHaloDiameter, ImColor(0xff0000ff), 32);
			}

			/*
			 * If the part is selected, as part of search or otherwise
			 */
			if (PartIsHighlighted(pin->component)) {
				color      = m_colors.pinDefaultColor;
				text_color = m_colors.pinDefaultTextColor;
				fill_pin   = false;
				draw_ring  = true;
				show_text  = true;
				threshold  = 0;
			}

			if (pin->type == Pin::kPinTypeTestPad) {
				color      = (m_colors.pinTestPadColor & cmask) | omask;
				fill_color = (m_colors.pinTestPadFillColor & cmask) | omask;
				show_text  = false;
			}

			// If the part itself is highlighted ( CVMShowPins )
			// if (p_pin->component->visualmode == p_pin->component->CVMSelected) {
			if (pin->component->visualmode == pin->component->CVMSelected) {
				color      = m_colors.pinDefaultColor;
				text_color = m_colors.pinDefaultTextColor;
				fill_pin   = false;
				draw_ring  = true;
				show_text  = true;
				threshold  = 0;
			}

			if (!pin->net || pin->type == Pin::kPinTypeNotConnected) {
				color = (m_colors.pinNotConnectedColor & cmask) | omask;
			} else {
				if (pin->net->is_ground) color = (m_colors.pinGroundColor & cmask) | omask;
			}

			// pin is on the same net as selected pin: highlight > rest
			if (m_pinSelected && pin->net == m_pinSelected->net) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				color      = m_colors.pinSameNetColor;
				text_color = m_colors.pinSameNetTextColor;
				fill_color = m_colors.pinSameNetFillColor;
				draw_ring  = false;
				fill_pin   = true;
				show_text  = true; // is this something we want? Maybe an optional thing?
				threshold  = 0;
			}

			// pin selected overwrites everything
			// if (p_pin == m_pinSelected) {
			if (pin == m_pinSelected) {
				if (psz < config.fontSize / 2) psz = config.fontSize / 2;
				color      = m_colors.pinSelectedColor;
				text_color = m_colors.pinSelectedTextColor;
				fill_color = m_colors.pinSelectedFillColor;
				draw_ring  = false;
				show_text  = true;
				fill_pin   = true;
				threshold  = 0;
			}

			// Check for BGA pin '1'
			//
			if (pin->name == "A1") {
				color = fill_color = m_colors.pinA1PadColor;
				fill_pin           = m_colors.pinA1PadColor;
				draw_ring          = false;
			}

			if ((pin->number == "1")) {
				if (pin->component->pins.size() >= static_cast<unsigned int>(config.pinA1threshold)) { // config.pinA1threshold is never negative
					color = fill_color = m_colors.pinA1PadColor;
					fill_pin           = m_colors.pinA1PadColor;
					draw_ring          = false;
				}
			}

			// don't show text if it doesn't make sense
			if (pin->component->pins.size() <= 1) show_text = false;
			if (pin->type == Pin::kPinTypeTestPad) show_text = false;
		}

		// Drawing
		{
			int segments;
			//			draw->ChannelsSetCurrent(kChannelImages);

			// for the round pin representations, choose how many circle segments need
			// based on the pin size
			segments = round(psz);
			if (segments > 32) segments = 32;
			if (segments < 8) segments = 8;
			float h = psz / 2 + 0.5f;

			/*
			 * if we're going to be showing the text of a pin, then we really
			 * should make sure that the drawn pin is at least as big as a single
			 * character so it doesn't look messy
			 */
			if ((show_text) && (psz < config.fontSize / 2)) psz = config.fontSize / 2;

			switch (pin->type) {
				case Pin::kPinTypeTestPad:
					if ((psz > 3) && (!config.slowCPU)) {
						draw->AddCircleFilled(ImVec2(pos.x, pos.y), psz, fill_color, segments);
						draw->AddCircle(ImVec2(pos.x, pos.y), psz, color, segments);
					} else if (psz > threshold) {
						draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
					}
					break;
				default:
					if ((psz > 3) && (psz > threshold)) {
						if (config.pinShapeSquare || config.slowCPU) {
							if (fill_pin)
								draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
							if (draw_ring) draw->AddRect(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), color);
						} else {
							if (fill_pin) draw->AddCircleFilled(ImVec2(pos.x, pos.y), psz, fill_color, segments);
							if (draw_ring) draw->AddCircle(ImVec2(pos.x, pos.y), psz, color, segments);
						}
					} else if (psz > threshold) {
						if (fill_pin) draw->AddRectFilled(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), fill_color);
						if (draw_ring) draw->AddRect(ImVec2(pos.x - h, pos.y - h), ImVec2(pos.x + h, pos.y + h), color);
					}
			}

			// if (p_pin == m_pinSelected) {
			//		if (pin.get() == m_pinSelected) {
			//			draw->AddCircle(ImVec2(pos.x, pos.y), psz + 1.25, m_colors.pinSelectedTextColor, segments);
			//		}

			//		if ((color == m_colors.pinSameNetColor) && (pinHalo == true)) {
			//			draw->AddCircle(ImVec2(pos.x, pos.y), psz * pinHaloDiameter, m_colors.pinHaloColor, segments,
			// config.pinHaloThickness);
			//		}

			// Show all pin names when config.showPinName is enabled and pin diameter is above threshold or show pin name only for selected part
			if ((config.showPinName && psz > 3) || show_text) {
				std::string text = pin->name + "\n" + pin->net->name;
				ImFont *font = ImGui::GetIO().Fonts->Fonts[0]; // Default font
				ImVec2 text_size_normalized = font->CalcTextSizeA(1.0f, FLT_MAX, 0.0f, text.c_str());

				float maxfontwidth = psz * 2.125/ text_size_normalized.x; // Fit horizontally with 6.75% overflow (should still avoid colliding with neighbours)
				float maxfontheight = psz * 1.5/ text_size_normalized.y; // Fit vertically with 25% top/bottom padding
				float maxfontsize = std::min(maxfontwidth, maxfontheight);

				// Font size for pin name only depends on height of text (rather than width of full text incl. net name) to scale to pin bounding box
				ImVec2 size_pin_name = font->CalcTextSizeA(maxfontheight, FLT_MAX, 0.0f, pin->name.c_str());
				// Font size for net name also depends on width of full text to avoid overflowing too much and colliding with text from other pin
				ImVec2 size_net_name = font->CalcTextSizeA(maxfontsize, FLT_MAX, 0.0f, pin->net->name.c_str());

				// Show pin name above net name, full text is centered vertically
				ImVec2 pos_pin_name   = ImVec2(pos.x - size_pin_name.x * 0.5f, pos.y - size_pin_name.y);
				ImVec2 pos_net_name   = ImVec2(pos.x - size_net_name.x * 0.5f, pos.y);

				ImFont *font_pin_name = font;
				if (maxfontheight < font->FontSize * 0.75) {
					font_pin_name = ImGui::GetIO().Fonts->Fonts[2]; // Use smaller font for pin name
				} else if (maxfontheight > font->FontSize * 1.5 && ImGui::GetIO().Fonts->Fonts[1]->FontSize > font->FontSize) {
					font_pin_name = ImGui::GetIO().Fonts->Fonts[1]; // Use larger font for pin name
				}

				ImFont *font_net_name = font;
				if (maxfontsize < font->FontSize * 0.75) {
					font_net_name = ImGui::GetIO().Fonts->Fonts[2]; // Use smaller font for net name
				} else if (maxfontsize > font->FontSize * 1.5 && ImGui::GetIO().Fonts->Fonts[1]->FontSize > font->FontSize) {
					font_net_name = ImGui::GetIO().Fonts->Fonts[1]; // Use larger font for net name
				}

				// Background rectangle
				draw->AddRectFilled(ImVec2(pos_net_name.x - m_scale * 0.5f, pos_net_name.y), // Begining of text with slight padding
										ImVec2(pos_net_name.x + size_net_name.x + m_scale * 0.5f, pos_net_name.y + size_net_name.y), // End of text with slight padding
										m_colors.pinTextBackgroundColor,
										m_scale * 0.5f/*rounding*/);

				draw->ChannelsSetCurrent(kChannelText);
				draw->AddText(font_pin_name, maxfontheight, pos_pin_name, text_color, pin->name.c_str());
				draw->AddText(font_net_name, maxfontsize, pos_net_name, text_color, pin->net->name.c_str());
				draw->ChannelsSetCurrent(kChannelPins);
			}
		}
	}
}